

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape_x86::forward(Reshape_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  float *pfVar4;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Mat *in_RDI;
  __m128 _v;
  int i_2;
  float *outptr_2;
  float *ptr;
  int q_1;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int i_1;
  float *outptr_1;
  float *ptr3_1;
  float *ptr2_1;
  float *ptr1_1;
  float *ptr0_1;
  int q;
  int size;
  Option opt_flatten_1;
  Mat bottom_blob_flattened_1;
  size_t out_elemsize_1;
  int out_elempack_2;
  int _c;
  int _d;
  int _h_1;
  int _w_1;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3;
  __m128 _row2;
  __m128 _row1;
  __m128 _row0;
  int j;
  float *outptr;
  float *ptr3;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int i;
  int outh;
  int outw;
  Option opt_flatten;
  Mat bottom_blob_flattened;
  size_t out_elemsize;
  int out_elempack_1;
  int _h;
  int _w;
  int total;
  size_t elemsize;
  int dims;
  int dims_1;
  int out_elempack;
  int ret;
  Mat top_blob_unpacked;
  Mat bottom_blob_unpacked;
  Option opt_pack;
  int elempack;
  Mat *in_stack_fffffffffffff568;
  Mat *in_stack_fffffffffffff570;
  Mat *in_stack_fffffffffffff578;
  size_t in_stack_fffffffffffff580;
  undefined8 in_stack_fffffffffffff588;
  int _w_00;
  Mat *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  int in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a4;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  int local_950;
  int local_94c;
  int local_844;
  int local_840;
  int local_80c;
  Mat local_808;
  float *local_7c0;
  float *local_7b8;
  int local_7ac;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  int local_724;
  Mat local_720;
  float *local_6d8;
  float *local_6d0;
  float *local_6c8;
  float *local_6c0;
  float *local_6b8;
  int local_6b0;
  int local_6ac;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  Mat local_660;
  long local_618;
  int local_60c;
  int local_608;
  int local_604;
  int local_600;
  int local_5fc;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  int local_574;
  float *local_570;
  float *local_568;
  float *local_560;
  float *local_558;
  float *local_550;
  int local_544;
  int local_540;
  int local_53c;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  Mat local_4f8;
  Allocator *local_4b0;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  ulong local_498;
  int local_48c;
  int local_488;
  undefined4 local_484;
  int local_480;
  int local_47c;
  Mat local_478;
  Mat local_420;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  int local_38c;
  undefined8 *local_388;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  int iVar5;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 local_2d8;
  undefined4 uStack_2d4;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  
  local_38c = in_RSI->elempack;
  local_388 = in_RCX;
  if (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1) {
    local_3d8 = *in_RCX;
    local_3c8 = in_RCX[2];
    uStack_3c0 = in_RCX[3];
    local_3b8 = in_RCX[4];
    uStack_3b0 = in_RCX[5];
    local_3a8 = in_RCX[6];
    uStack_3a0 = in_RCX[7];
    uStack_3d0 = in_RCX[2];
    ncnn::Mat::Mat(&local_420);
    convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                    (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                    in_stack_fffffffffffff5a4,
                    (Option *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
    ncnn::Mat::Mat(&local_478);
    local_47c = Reshape::forward((Reshape *)
                                 CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                                 in_RDI,in_RSI,(Option *)in_RDX);
    iVar5 = local_47c;
    if (local_47c == 0) {
      local_484 = 1;
      if ((*(byte *)((long)local_388 + 0x27) & 1) != 0) {
        local_488 = local_478.dims;
        if ((local_478.dims == 1) && (local_484 = 1, local_478.w % 4 == 0)) {
          local_484 = 4;
        }
        if ((local_478.dims == 2) && (local_484 = 1, local_478.h % 4 == 0)) {
          local_484 = 4;
        }
        if (((local_478.dims == 3) || (local_478.dims == 4)) &&
           (local_484 = 1, local_478.c % 4 == 0)) {
          local_484 = 4;
        }
      }
      convert_packing((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                      (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                      in_stack_fffffffffffff5a4,
                      (Option *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
      iVar5 = 0;
    }
    local_480 = 1;
    ncnn::Mat::~Mat((Mat *)0x4f832e);
    ncnn::Mat::~Mat((Mat *)0x4f833b);
  }
  else if (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1) {
    flatten((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
            (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
            (Option *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
    bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
    if (bVar3) {
      iVar5 = -100;
    }
    else {
      iVar5 = 0;
    }
  }
  else {
    local_48c = in_RSI->dims;
    local_498 = in_RSI->elemsize;
    local_49c = in_RSI->w * in_RSI->h * in_RSI->d * in_RSI->c * local_38c;
    if (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 2) {
      local_4a0 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
      local_4a4 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
      if (local_4a0 == 0) {
        if (local_48c == 1) {
          local_840 = in_RSI->w * local_38c;
        }
        else {
          local_840 = in_RSI->w;
        }
        local_4a0 = local_840;
      }
      if (local_4a4 == 0) {
        if (local_48c == 2) {
          local_844 = in_RSI->h * local_38c;
        }
        else {
          local_844 = in_RSI->h;
        }
        local_4a4 = local_844;
      }
      if (local_4a0 == -1) {
        local_4a0 = local_49c / local_4a4;
      }
      if (local_4a4 == -1) {
        local_4a4 = local_49c / local_4a0;
      }
      local_4a8 = 1;
      if (((*(byte *)((long)in_RCX + 0x27) & 1) != 0) && (local_4a8 = 1, local_4a4 % 4 == 0)) {
        local_4a8 = 4;
      }
      local_4b0 = (Allocator *)((local_498 / (ulong)(long)local_38c) * (long)local_4a8);
      if (((local_48c == 2) && (in_RSI->h * local_38c == local_4a4)) && (local_38c == local_4a8)) {
        ncnn::Mat::operator=(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
        return 0;
      }
      if (local_4a8 == 1) {
        flatten((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                (Option *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
        bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
        if (!bVar3) {
          in_RDX->dims = 2;
          in_RDX->w = local_4a0;
          in_RDX->h = local_4a4;
          in_RDX->cstep = (long)local_4a0 * (long)local_4a4;
          in_RDX->elemsize = (size_t)local_4b0;
          in_RDX->elempack = local_4a8;
          return 0;
        }
        return -100;
      }
      ncnn::Mat::Mat(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      local_538 = *local_388;
      local_528 = local_388[2];
      uStack_520 = local_388[3];
      local_518 = local_388[4];
      uStack_510 = local_388[5];
      local_508 = local_388[6];
      uStack_500 = local_388[7];
      uStack_530 = local_388[2];
      flatten((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
              (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
              (Option *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
      bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
      if (bVar3) {
        in_stack_fffffffffffffc9c = -100;
        local_480 = 1;
      }
      else {
        ncnn::Mat::create(in_stack_fffffffffffff590,(int)((ulong)in_stack_fffffffffffff588 >> 0x20),
                          (int)in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                          (int)((ulong)in_stack_fffffffffffff578 >> 0x20),
                          (Allocator *)in_stack_fffffffffffff570);
        bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
        if (bVar3) {
          in_stack_fffffffffffffc9c = -100;
          local_480 = 1;
        }
        else {
          local_53c = in_RDX->w;
          local_540 = in_RDX->h;
          if (local_4a8 == 4) {
            for (local_544 = 0; local_544 < local_540; local_544 = local_544 + 1) {
              local_550 = ncnn::Mat::operator_cast_to_float_(&local_4f8);
              local_550 = local_550 + local_53c * local_544 * 4;
              local_558 = ncnn::Mat::operator_cast_to_float_(&local_4f8);
              local_558 = local_558 + local_53c * (local_544 * 4 + 1);
              local_560 = ncnn::Mat::operator_cast_to_float_(&local_4f8);
              local_560 = local_560 + local_53c * (local_544 * 4 + 2);
              local_568 = ncnn::Mat::operator_cast_to_float_(&local_4f8);
              local_568 = local_568 + local_53c * (local_544 * 4 + 3);
              local_570 = ncnn::Mat::row(in_RDX,local_544);
              for (local_574 = 0; local_574 + 3 < local_53c; local_574 = local_574 + 4) {
                local_2a8 = (undefined4)*(undefined8 *)local_550;
                uStack_2a4 = (undefined4)((ulong)*(undefined8 *)local_550 >> 0x20);
                local_2b8 = (undefined4)*(undefined8 *)local_558;
                uStack_2b4 = (undefined4)((ulong)*(undefined8 *)local_558 >> 0x20);
                local_5f8 = CONCAT44(local_2b8,local_2a8);
                uStack_5f0 = CONCAT44(uStack_2b4,uStack_2a4);
                local_2c8 = (undefined4)*(undefined8 *)local_560;
                uStack_2c4 = (undefined4)((ulong)*(undefined8 *)local_560 >> 0x20);
                local_2d8 = (undefined4)*(undefined8 *)local_568;
                uStack_2d4 = (undefined4)((ulong)*(undefined8 *)local_568 >> 0x20);
                local_5d8 = CONCAT44(local_2d8,local_2c8);
                uStack_5d0 = CONCAT44(uStack_2d4,uStack_2c4);
                uStack_220 = (undefined4)*(undefined8 *)(local_550 + 2);
                uStack_21c = (undefined4)((ulong)*(undefined8 *)(local_550 + 2) >> 0x20);
                uStack_230 = (undefined4)*(undefined8 *)(local_558 + 2);
                uStack_22c = (undefined4)((ulong)*(undefined8 *)(local_558 + 2) >> 0x20);
                local_5e8 = CONCAT44(uStack_230,uStack_220);
                uStack_5e0 = CONCAT44(uStack_22c,uStack_21c);
                uStack_240 = (undefined4)*(undefined8 *)(local_560 + 2);
                uStack_23c = (undefined4)((ulong)*(undefined8 *)(local_560 + 2) >> 0x20);
                uStack_250 = (undefined4)*(undefined8 *)(local_568 + 2);
                uStack_24c = (undefined4)((ulong)*(undefined8 *)(local_568 + 2) >> 0x20);
                local_5c8 = CONCAT44(uStack_250,uStack_240);
                uStack_5c0 = CONCAT44(uStack_24c,uStack_23c);
                local_588 = CONCAT44(local_2b8,local_2a8);
                uStack_580 = CONCAT44(local_2d8,local_2c8);
                local_598 = CONCAT44(uStack_2b4,uStack_2a4);
                uStack_590 = CONCAT44(uStack_2d4,uStack_2c4);
                local_5a8 = CONCAT44(uStack_230,uStack_220);
                uStack_5a0 = CONCAT44(uStack_250,uStack_240);
                local_5b8 = CONCAT44(uStack_22c,uStack_21c);
                uStack_5b0 = CONCAT44(uStack_24c,uStack_23c);
                *(undefined8 *)local_570 = local_588;
                *(undefined8 *)(local_570 + 2) = uStack_580;
                *(undefined8 *)(local_570 + 4) = local_598;
                *(undefined8 *)(local_570 + 6) = uStack_590;
                *(undefined8 *)(local_570 + 8) = local_5a8;
                *(undefined8 *)(local_570 + 10) = uStack_5a0;
                *(undefined8 *)(local_570 + 0xc) = local_5b8;
                *(undefined8 *)(local_570 + 0xe) = uStack_5b0;
                local_550 = local_550 + 4;
                local_558 = local_558 + 4;
                local_560 = local_560 + 4;
                local_568 = local_568 + 4;
                local_570 = local_570 + 0x10;
              }
              for (; local_574 < local_53c; local_574 = local_574 + 1) {
                *local_570 = *local_550;
                local_570[1] = *local_558;
                local_570[2] = *local_560;
                local_570[3] = *local_568;
                local_570 = local_570 + 4;
                local_568 = local_568 + 1;
                local_560 = local_560 + 1;
                local_558 = local_558 + 1;
                local_550 = local_550 + 1;
              }
            }
          }
          local_480 = 0;
        }
      }
      ncnn::Mat::~Mat((Mat *)0x4f8fa0);
      if (local_480 != 0) {
        return in_stack_fffffffffffffc9c;
      }
    }
    if ((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) ||
       (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 4)) {
      local_5fc = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18));
      local_600 = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4);
      local_604 = *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
      local_608 = *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4);
      if (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) {
        if (local_5fc == 0) {
          if (local_48c == 1) {
            local_94c = in_RSI->w * local_38c;
          }
          else {
            local_94c = in_RSI->w;
          }
          local_5fc = local_94c;
        }
        if (local_600 == 0) {
          if (local_48c == 2) {
            local_950 = in_RSI->h * local_38c;
          }
          else {
            local_950 = in_RSI->h;
          }
          local_600 = local_950;
        }
        if (local_608 == 0) {
          if (local_48c == 3) {
            local_954 = in_RSI->c * local_38c;
          }
          else {
            local_954 = in_RSI->c;
          }
          local_608 = local_954;
        }
        if (local_5fc == -1) {
          local_5fc = (int)((long)((ulong)(uint)((int)((long)local_49c / (long)local_608) >> 0x1f)
                                   << 0x20 | (long)local_49c / (long)local_608 & 0xffffffffU) /
                           (long)local_600);
        }
        if (local_600 == -1) {
          local_600 = (int)((long)((ulong)(uint)((int)((long)local_49c / (long)local_608) >> 0x1f)
                                   << 0x20 | (long)local_49c / (long)local_608 & 0xffffffffU) /
                           (long)local_5fc);
        }
        if (local_608 == -1) {
          local_608 = (int)((long)((ulong)(uint)((int)((long)local_49c / (long)local_600) >> 0x1f)
                                   << 0x20 | (long)local_49c / (long)local_600 & 0xffffffffU) /
                           (long)local_5fc);
        }
      }
      else {
        if (local_5fc == 0) {
          if (local_48c == 1) {
            local_958 = in_RSI->w * local_38c;
          }
          else {
            local_958 = in_RSI->w;
          }
          local_5fc = local_958;
        }
        if (local_600 == 0) {
          if (local_48c == 2) {
            local_95c = in_RSI->h * local_38c;
          }
          else {
            local_95c = in_RSI->h;
          }
          local_600 = local_95c;
        }
        if (local_604 == 0) {
          local_604 = in_RSI->d;
        }
        if (local_608 == 0) {
          if ((local_48c == 3) || (local_48c == 4)) {
            local_960 = in_RSI->c * local_38c;
          }
          else {
            local_960 = in_RSI->c;
          }
          local_608 = local_960;
        }
        if (local_5fc == -1) {
          uVar1 = (long)((ulong)(uint)((int)((long)local_49c / (long)local_608) >> 0x1f) << 0x20 |
                        (long)local_49c / (long)local_608 & 0xffffffffU) / (long)local_604;
          local_5fc = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                           (long)local_600);
        }
        if (local_600 == -1) {
          uVar1 = (long)((ulong)(uint)((int)((long)local_49c / (long)local_608) >> 0x1f) << 0x20 |
                        (long)local_49c / (long)local_608 & 0xffffffffU) / (long)local_604;
          local_600 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                           (long)local_5fc);
        }
        if (local_604 == -1) {
          uVar1 = (long)((ulong)(uint)((int)((long)local_49c / (long)local_608) >> 0x1f) << 0x20 |
                        (long)local_49c / (long)local_608 & 0xffffffffU) / (long)local_600;
          local_604 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                           (long)local_5fc);
        }
        if (local_608 == -1) {
          uVar1 = (long)((ulong)(uint)((int)((long)local_49c / (long)local_604) >> 0x1f) << 0x20 |
                        (long)local_49c / (long)local_604 & 0xffffffffU) / (long)local_600;
          local_608 = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                           (long)local_5fc);
        }
      }
      local_60c = 1;
      if (((*(byte *)((long)local_388 + 0x27) & 1) != 0) && (local_60c = 1, local_608 % 4 == 0)) {
        local_60c = 4;
      }
      local_618 = (local_498 / (ulong)(long)local_38c) * (long)local_60c;
      if (((local_48c == 3) && (in_RSI->c * local_38c == local_608)) && (local_38c == local_60c)) {
        ncnn::Mat::operator=(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
        in_RDX->w = local_5fc;
        in_RDX->h = local_600;
        return 0;
      }
      if (((local_48c == 4) && (in_RSI->c * local_38c == local_608)) && (local_38c == local_60c)) {
        ncnn::Mat::operator=(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
        in_RDX->w = local_5fc;
        in_RDX->h = local_600;
        in_RDX->d = local_604;
        return 0;
      }
      ncnn::Mat::Mat(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      local_6a8 = *local_388;
      local_698 = local_388[2];
      uStack_690 = local_388[3];
      local_688 = local_388[4];
      uStack_680 = local_388[5];
      local_678 = local_388[6];
      uStack_670 = local_388[7];
      uStack_6a0 = local_388[2];
      flatten((Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
              (Mat *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
              (Option *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
      bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
      if (bVar3) {
        in_stack_fffffffffffffc9c = -100;
        local_480 = 1;
      }
      else {
        iVar5 = (int)(in_stack_fffffffffffff580 >> 0x20);
        _w_00 = (int)((ulong)in_stack_fffffffffffff588 >> 0x20);
        if (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 3) {
          ncnn::Mat::create(in_stack_fffffffffffff590,_w_00,(int)in_stack_fffffffffffff588,iVar5,
                            (size_t)in_stack_fffffffffffff578,
                            (int)((ulong)in_stack_fffffffffffff570 >> 0x20),
                            (Allocator *)
                            CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
          uStack_25c = in_stack_fffffffffffff598;
          uStack_26c = in_stack_fffffffffffff59c;
        }
        else {
          in_stack_fffffffffffff570 = (Mat *)local_388[1];
          ncnn::Mat::create(in_stack_fffffffffffff590,_w_00,(int)in_stack_fffffffffffff588,iVar5,
                            (int)in_stack_fffffffffffff580,(size_t)in_stack_fffffffffffff578,
                            in_stack_fffffffffffff5a0,
                            (Allocator *)
                            CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8));
          uStack_25c = in_stack_fffffffffffff598;
          uStack_26c = in_stack_fffffffffffff59c;
        }
        bVar3 = ncnn::Mat::empty(in_stack_fffffffffffff570);
        if (bVar3) {
          in_stack_fffffffffffffc9c = -100;
          local_480 = 1;
        }
        else {
          local_6ac = in_RDX->w * in_RDX->h * in_RDX->d;
          if (local_60c == 4) {
            for (local_6b0 = 0; local_6b0 < in_RDX->c; local_6b0 = local_6b0 + 1) {
              local_6b8 = ncnn::Mat::operator_cast_to_float_(&local_660);
              local_6b8 = local_6b8 + local_6ac * local_6b0 * 4;
              local_6c0 = ncnn::Mat::operator_cast_to_float_(&local_660);
              local_6c0 = local_6c0 + local_6ac * (local_6b0 * 4 + 1);
              local_6c8 = ncnn::Mat::operator_cast_to_float_(&local_660);
              local_6c8 = local_6c8 + local_6ac * (local_6b0 * 4 + 2);
              local_6d0 = ncnn::Mat::operator_cast_to_float_(&local_660);
              local_6d0 = local_6d0 + local_6ac * (local_6b0 * 4 + 3);
              ncnn::Mat::channel((Mat *)CONCAT44(uStack_26c,uStack_25c),
                                 (int)((ulong)in_stack_fffffffffffff590 >> 0x20));
              pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_720);
              ncnn::Mat::~Mat((Mat *)0x4f98cc);
              local_6d8 = pfVar4;
              for (local_724 = 0; local_724 + 3 < local_6ac; local_724 = local_724 + 4) {
                local_2e8 = (undefined4)*(undefined8 *)local_6b8;
                uStack_2e4 = (undefined4)((ulong)*(undefined8 *)local_6b8 >> 0x20);
                local_2f8 = (undefined4)*(undefined8 *)local_6c0;
                uStack_2f4 = (undefined4)((ulong)*(undefined8 *)local_6c0 >> 0x20);
                local_7a8 = CONCAT44(local_2f8,local_2e8);
                uStack_7a0 = CONCAT44(uStack_2f4,uStack_2e4);
                local_308 = (undefined4)*(undefined8 *)local_6c8;
                uStack_304 = (undefined4)((ulong)*(undefined8 *)local_6c8 >> 0x20);
                local_318 = (undefined4)*(undefined8 *)local_6d0;
                uStack_314 = (undefined4)((ulong)*(undefined8 *)local_6d0 >> 0x20);
                local_788 = CONCAT44(local_318,local_308);
                uStack_780 = CONCAT44(uStack_314,uStack_304);
                uStack_260 = (undefined4)*(undefined8 *)(local_6b8 + 2);
                uStack_25c = (undefined4)((ulong)*(undefined8 *)(local_6b8 + 2) >> 0x20);
                uStack_270 = (undefined4)*(undefined8 *)(local_6c0 + 2);
                uStack_26c = (undefined4)((ulong)*(undefined8 *)(local_6c0 + 2) >> 0x20);
                local_798 = CONCAT44(uStack_270,uStack_260);
                uStack_790 = CONCAT44(uStack_26c,uStack_25c);
                uStack_280 = (undefined4)*(undefined8 *)(local_6c8 + 2);
                uStack_27c = (undefined4)((ulong)*(undefined8 *)(local_6c8 + 2) >> 0x20);
                uStack_290 = (undefined4)*(undefined8 *)(local_6d0 + 2);
                uStack_28c = (undefined4)((ulong)*(undefined8 *)(local_6d0 + 2) >> 0x20);
                local_778 = CONCAT44(uStack_290,uStack_280);
                uStack_770 = CONCAT44(uStack_28c,uStack_27c);
                local_738 = CONCAT44(local_2f8,local_2e8);
                uStack_730 = CONCAT44(local_318,local_308);
                local_748 = CONCAT44(uStack_2f4,uStack_2e4);
                uStack_740 = CONCAT44(uStack_314,uStack_304);
                local_758 = CONCAT44(uStack_270,uStack_260);
                uStack_750 = CONCAT44(uStack_290,uStack_280);
                local_768 = CONCAT44(uStack_26c,uStack_25c);
                uStack_760 = CONCAT44(uStack_28c,uStack_27c);
                *(undefined8 *)local_6d8 = local_738;
                *(undefined8 *)(local_6d8 + 2) = uStack_730;
                *(undefined8 *)(local_6d8 + 4) = local_748;
                *(undefined8 *)(local_6d8 + 6) = uStack_740;
                *(undefined8 *)(local_6d8 + 8) = local_758;
                *(undefined8 *)(local_6d8 + 10) = uStack_750;
                *(undefined8 *)(local_6d8 + 0xc) = local_768;
                *(undefined8 *)(local_6d8 + 0xe) = uStack_760;
                local_6b8 = local_6b8 + 4;
                local_6c0 = local_6c0 + 4;
                local_6c8 = local_6c8 + 4;
                local_6d0 = local_6d0 + 4;
                local_6d8 = local_6d8 + 0x10;
              }
              for (; local_724 < local_6ac; local_724 = local_724 + 1) {
                *local_6d8 = *local_6b8;
                local_6d8[1] = *local_6c0;
                local_6d8[2] = *local_6c8;
                local_6d8[3] = *local_6d0;
                local_6d8 = local_6d8 + 4;
                local_6d0 = local_6d0 + 1;
                local_6c8 = local_6c8 + 1;
                local_6c0 = local_6c0 + 1;
                local_6b8 = local_6b8 + 1;
              }
            }
          }
          if (local_60c == 1) {
            for (local_7ac = 0; local_7ac < in_RDX->c; local_7ac = local_7ac + 1) {
              pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_660);
              local_7b8 = pfVar4 + local_6ac * local_7ac;
              ncnn::Mat::channel((Mat *)CONCAT44(uStack_26c,uStack_25c),(int)((ulong)pfVar4 >> 0x20)
                                );
              pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_808);
              ncnn::Mat::~Mat((Mat *)0x4f9f2c);
              local_7c0 = pfVar4;
              for (local_80c = 0; local_80c + 3 < local_6ac; local_80c = local_80c + 4) {
                uVar2 = *(undefined8 *)(local_7b8 + 2);
                *(undefined8 *)local_7c0 = *(undefined8 *)local_7b8;
                *(undefined8 *)(local_7c0 + 2) = uVar2;
                local_7b8 = local_7b8 + 4;
                local_7c0 = local_7c0 + 4;
              }
              for (; local_80c < local_6ac; local_80c = local_80c + 1) {
                *local_7c0 = *local_7b8;
                local_7c0 = local_7c0 + 1;
                local_7b8 = local_7b8 + 1;
              }
            }
          }
          local_480 = 0;
        }
      }
      ncnn::Mat::~Mat((Mat *)0x4fa0ac);
      if (local_480 != 0) {
        return in_stack_fffffffffffffc9c;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int Reshape_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (permute == 1)
    {
        // TODO implement permute on-the-fly
        Option opt_pack = opt;
        opt_pack.blob_allocator = opt.workspace_allocator;

        Mat bottom_blob_unpacked;
        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack);

        Mat top_blob_unpacked;
        int ret = Reshape::forward(bottom_blob_unpacked, top_blob_unpacked, opt_pack);
        if (ret != 0)
            return ret;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            // resolve dst_elempack
            int dims = top_blob_unpacked.dims;
#if __AVX__
            if (dims == 1) out_elempack = top_blob_unpacked.w % 8 == 0 ? 8 : top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 8 == 0 ? 8 : top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 8 == 0 ? 8 : top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#else
            if (dims == 1) out_elempack = top_blob_unpacked.w % 4 == 0 ? 4 : 1;
            if (dims == 2) out_elempack = top_blob_unpacked.h % 4 == 0 ? 4 : 1;
            if (dims == 3 || dims == 4) out_elempack = top_blob_unpacked.c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);

        return 0;
    }

    if (ndim == 1)
    {
        // flatten
        flatten(bottom_blob, top_blob, opt);
        if (top_blob.empty())
            return -100;

        return 0;
    }

    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c * elempack;

    if (ndim == 2)
    {
        int _w = w;
        int _h = h;

        if (_w == 0)
            _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
        if (_h == 0)
            _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;

        if (_w == -1)
            _w = total / _h;
        if (_h == -1)
            _h = total / _w;

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _h % 8 == 0 ? 8 : _h % 4 == 0 ? 4 : 1;
#else
            out_elempack = _h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 2 && bottom_blob.h * elempack == _h && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (out_elempack == 1)
        {
            // flatten
            flatten(bottom_blob, top_blob, opt);
            if (top_blob.empty())
                return -100;

            top_blob.dims = 2;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.cstep = (size_t)_w * _h;
            top_blob.elemsize = out_elemsize;
            top_blob.elempack = out_elempack;

            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        top_blob.create(_w, _h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int outw = top_blob.w;
        int outh = top_blob.h;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + outw * (i * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + outw * (i * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + outw * (i * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + outw * (i * 8 + 7);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + outw * i * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + outw * (i * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + outw * (i * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + outw * (i * 4 + 3);
                float* outptr = top_blob.row(i);

                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; j < outw; j++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (ndim == 3 || ndim == 4)
    {
        int _w = w;
        int _h = h;
        int _d = d;
        int _c = c;

        if (ndim == 3)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_c == 0)
                _c = dims == 3 ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _h;
            if (_h == -1)
                _h = total / _c / _w;
            if (_c == -1)
                _c = total / _h / _w;
        }
        else // if (ndim == 4)
        {
            if (_w == 0)
                _w = dims == 1 ? bottom_blob.w * elempack : bottom_blob.w;
            if (_h == 0)
                _h = dims == 2 ? bottom_blob.h * elempack : bottom_blob.h;
            if (_d == 0)
                _d = bottom_blob.d;
            if (_c == 0)
                _c = (dims == 3 || dims == 4) ? bottom_blob.c * elempack : bottom_blob.c;

            if (_w == -1)
                _w = total / _c / _d / _h;
            if (_h == -1)
                _h = total / _c / _d / _w;
            if (_d == -1)
                _d = total / _c / _h / _w;
            if (_c == -1)
                _c = total / _d / _h / _w;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            out_elempack = _c % 8 == 0 ? 8 : _c % 4 == 0 ? 4 : 1;
#else
            out_elempack = _c % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        if (dims == 3 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            return 0;
        }
        if (dims == 4 && bottom_blob.c * elempack == _c && elempack == out_elempack)
        {
            top_blob = bottom_blob;
            top_blob.w = _w;
            top_blob.h = _h;
            top_blob.d = _d;
            return 0;
        }

        // flatten
        Mat bottom_blob_flattened = bottom_blob;
        {
            Option opt_flatten = opt;
            opt_flatten.blob_allocator = opt.workspace_allocator;

            flatten(bottom_blob, bottom_blob_flattened, opt_flatten);
            if (bottom_blob_flattened.empty())
                return -100;
        }

        if (ndim == 3)
        {
            top_blob.create(_w, _h, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        else // if (ndim == 4)
        {
            top_blob.create(_w, _h, _d, _c / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        }
        if (top_blob.empty())
            return -100;

        int size = top_blob.w * top_blob.h * top_blob.d;

#if __SSE2__
#if __AVX__
        if (out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 8;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 8 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 8 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 8 + 3);
                const float* ptr4 = (const float*)bottom_blob_flattened + size * (q * 8 + 4);
                const float* ptr5 = (const float*)bottom_blob_flattened + size * (q * 8 + 5);
                const float* ptr6 = (const float*)bottom_blob_flattened + size * (q * 8 + 6);
                const float* ptr7 = (const float*)bottom_blob_flattened + size * (q * 8 + 7);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr0);
                    __m256 _row1 = _mm256_loadu_ps(ptr1);
                    __m256 _row2 = _mm256_loadu_ps(ptr2);
                    __m256 _row3 = _mm256_loadu_ps(ptr3);
                    __m256 _row4 = _mm256_loadu_ps(ptr4);
                    __m256 _row5 = _mm256_loadu_ps(ptr5);
                    __m256 _row6 = _mm256_loadu_ps(ptr6);
                    __m256 _row7 = _mm256_loadu_ps(ptr7);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr, _row0);
                    _mm256_storeu_ps(outptr + 8, _row1);
                    _mm256_storeu_ps(outptr + 16, _row2);
                    _mm256_storeu_ps(outptr + 24, _row3);
                    _mm256_storeu_ps(outptr + 32, _row4);
                    _mm256_storeu_ps(outptr + 40, _row5);
                    _mm256_storeu_ps(outptr + 48, _row6);
                    _mm256_storeu_ps(outptr + 56, _row7);

                    ptr0 += 8;
                    ptr1 += 8;
                    ptr2 += 8;
                    ptr3 += 8;
                    ptr4 += 8;
                    ptr5 += 8;
                    ptr6 += 8;
                    ptr7 += 8;
                    outptr += 64;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;
                    outptr[4] = *ptr4++;
                    outptr[5] = *ptr5++;
                    outptr[6] = *ptr6++;
                    outptr[7] = *ptr7++;

                    outptr += 8;
                }
            }
        }
#endif // __AVX__

        if (out_elempack == 4)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr0 = (const float*)bottom_blob_flattened + size * q * 4;
                const float* ptr1 = (const float*)bottom_blob_flattened + size * (q * 4 + 1);
                const float* ptr2 = (const float*)bottom_blob_flattened + size * (q * 4 + 2);
                const float* ptr3 = (const float*)bottom_blob_flattened + size * (q * 4 + 3);
                float* outptr = top_blob.channel(q);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr0);
                    __m128 _row1 = _mm_loadu_ps(ptr1);
                    __m128 _row2 = _mm_loadu_ps(ptr2);
                    __m128 _row3 = _mm_loadu_ps(ptr3);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr, _row0);
                    _mm_storeu_ps(outptr + 4, _row1);
                    _mm_storeu_ps(outptr + 8, _row2);
                    _mm_storeu_ps(outptr + 12, _row3);

                    ptr0 += 4;
                    ptr1 += 4;
                    ptr2 += 4;
                    ptr3 += 4;
                    outptr += 16;
                }
                for (; i < size; i++)
                {
                    outptr[0] = *ptr0++;
                    outptr[1] = *ptr1++;
                    outptr[2] = *ptr2++;
                    outptr[3] = *ptr3++;

                    outptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < top_blob.c; q++)
            {
                const float* ptr = (const float*)bottom_blob_flattened + size * q;
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i + 3 < size; i += 4)
                {
                    __m128 _v = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(outptr, _v);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}